

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buddy_allocator.h
# Opt level: O3

void __thiscall
cppcms::impl::buddy_allocator::test_consistent
          (buddy_allocator *this,void **allocated,size_t allocated_size)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  void *pvVar3;
  key_type ppVar4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  ostream *poVar7;
  runtime_error *prVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  page *p;
  map<cppcms::impl::buddy_allocator::page_*,_bool,_std::less<cppcms::impl::buddy_allocator::page_*>,_std::allocator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>_>
  all_pages;
  ostringstream oss;
  string local_200 [32];
  key_type local_1e0;
  _Rb_tree<cppcms::impl::buddy_allocator::page_*,_std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>,_std::_Select1st<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>,_std::less<cppcms::impl::buddy_allocator::page_*>,_std::allocator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>_>
  local_1d8;
  ostringstream local_1a8 [376];
  
  p_Var1 = &local_1d8._M_impl.super__Rb_tree_header;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  test_and_get_free_pages
            (this,(map<cppcms::impl::buddy_allocator::page_*,_bool,_std::less<cppcms::impl::buddy_allocator::page_*>,_std::allocator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>_>
                   *)&local_1d8);
  if (allocated_size != 0) {
    sVar12 = 0;
    do {
      pvVar3 = allocated[sVar12];
      if (pvVar3 != (void *)0x0) {
        local_1e0 = (key_type)((long)pvVar3 - 0x10);
        if ((*(byte *)((long)pvVar3 + -0xf) & 1) == 0) {
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/buddy_allocator.h"
                     ,0x62);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0xa7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," p->bits & page_in_use",0x16);
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar8,local_200);
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        p_Var6 = local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var11 = &p_Var1->_M_header;
        if (local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          do {
            p_Var10 = p_Var11;
            p_Var9 = p_Var6;
            ppVar4 = *(key_type *)(p_Var9 + 1);
            p_Var11 = p_Var9;
            if (ppVar4 < local_1e0) {
              p_Var11 = p_Var10;
            }
            p_Var6 = (&p_Var9->_M_left)[ppVar4 < local_1e0];
          } while ((&p_Var9->_M_left)[ppVar4 < local_1e0] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var11 != p_Var1) {
            if (ppVar4 < local_1e0) {
              p_Var9 = p_Var10;
            }
            if (*(key_type *)(p_Var9 + 1) <= local_1e0) {
              std::__cxx11::ostringstream::ostringstream(local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error ",6);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/buddy_allocator.h"
                         ,0x62);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0xa8);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7," all_pages.find(p)==all_pages.end()",0x23);
              prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::stringbuf::str();
              std::runtime_error::runtime_error(prVar8,local_200);
              __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
          }
        }
        pmVar5 = std::
                 map<cppcms::impl::buddy_allocator::page_*,_bool,_std::less<cppcms::impl::buddy_allocator::page_*>,_std::allocator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>_>
                 ::operator[]((map<cppcms::impl::buddy_allocator::page_*,_bool,_std::less<cppcms::impl::buddy_allocator::page_*>,_std::allocator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>_>
                               *)&local_1d8,&local_1e0);
        *pmVar5 = false;
      }
      sVar12 = sVar12 + 1;
    } while (sVar12 != allocated_size);
  }
  if ((_Rb_tree_header *)local_1d8._M_impl.super__Rb_tree_header._M_header._M_left == p_Var1) {
    uVar13 = this->memory_size_;
    uVar14 = 0;
  }
  else {
    uVar13 = this->memory_size_;
    uVar14 = 0;
    p_Var6 = local_1d8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      uVar2 = **(uint **)(p_Var6 + 1);
      if ((uVar2 >> 8 & 1) == (uint)*(byte *)&p_Var6[1]._M_parent) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/buddy_allocator.h"
                   ,0x62);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0xaf);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7," is_free == !(p->bits & page_in_use)",0x24);
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar8,local_200);
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (uVar14 != (long)*(uint **)(p_Var6 + 1) - (long)(this + 1)) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/buddy_allocator.h"
                   ,0x62);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0xb1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," pos == page_pos",0x10);
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar8,local_200);
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar14 = uVar14 + (1L << ((byte)uVar2 & 0x3f));
      if (uVar13 < uVar14) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/buddy_allocator.h"
                   ,0x62);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0xb4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," pos <= memory_size_",0x14);
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar8,local_200);
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  if (0x1f < uVar13 - uVar14) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/buddy_allocator.h"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0xb6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," memory_size_ - pos < size_t(alignment * 2)",0x2b);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,local_200);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  _Rb_tree<cppcms::impl::buddy_allocator::page_*,_std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>,_std::_Select1st<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>,_std::less<cppcms::impl::buddy_allocator::page_*>,_std::allocator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>_>
  ::~_Rb_tree(&local_1d8);
  return;
}

Assistant:

void test_consistent(void * const *allocated,size_t allocated_size)
	{
		std::map<page *,bool> all_pages;
		test_and_get_free_pages(&all_pages);
		for(size_t i=0;i<allocated_size;i++) {
			if(allocated[i]==0)
				continue;
			page *p=reinterpret_cast<page *>(static_cast<char *>(allocated[i]) - alignment);
			TEST(p->bits & page_in_use);
			TEST(all_pages.find(p)==all_pages.end());
			all_pages[p]=false;
		}
		size_t pos = 0;
		for(std::map<page *,bool>::const_iterator pg=all_pages.begin();pg!=all_pages.end();++pg) {
			page *p=pg->first;
			bool is_free = pg->second;
			TEST(is_free == !(p->bits & page_in_use));
			size_t page_pos = reinterpret_cast<char *>(pg->first) - memory();
			TEST(pos == page_pos);
			size_t page_size = size_t(1) << (pg->first->bits & 0xFF);
			pos+= page_size;
			TEST(pos <= memory_size_);
		}
		TEST(memory_size_ - pos < size_t(alignment * 2));
	}